

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O3

CURLUcode Curl_parse_port(Curl_URL *u,char *hostname)

{
  int iVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  char endbracket;
  int len;
  char *rest;
  char portbuf [7];
  char local_35;
  int local_34;
  char *local_30;
  char local_27 [7];
  
  iVar1 = __isoc99_sscanf(hostname,"[%*45[0123456789abcdefABCDEF:.]%c%n",&local_35);
  iVar2 = local_34;
  if (iVar1 == 1) {
    if (local_35 == '%') {
      iVar1 = __isoc99_sscanf(hostname + local_34,"%*[^]]%c%n",&local_35);
      if (iVar1 != 1) {
        return CURLUE_MALFORMED_INPUT;
      }
      if (local_35 != ']') {
        return CURLUE_MALFORMED_INPUT;
      }
      local_34 = iVar2 + local_34;
    }
    else if (local_35 != ']') {
      return CURLUE_MALFORMED_INPUT;
    }
    if (hostname == (char *)0x0) {
      return CURLUE_OK;
    }
    if (hostname[local_34] == '\0') {
      return CURLUE_OK;
    }
    if (hostname[local_34] != ':') {
      return CURLUE_MALFORMED_INPUT;
    }
    pcVar4 = hostname + local_34;
  }
  else {
    pcVar4 = strchr(hostname,0x3a);
    if (pcVar4 == (char *)0x0) {
      return CURLUE_OK;
    }
  }
  if (pcVar4[1] == 0) {
    *pcVar4 = '\0';
  }
  else {
    iVar2 = Curl_isdigit((uint)(byte)pcVar4[1]);
    if (iVar2 == 0) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    lVar3 = strtol(pcVar4 + 1,&local_30,10);
    if (lVar3 - 0x10000U < 0xffffffffffff0001) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    if (*local_30 != '\0') {
      return CURLUE_BAD_PORT_NUMBER;
    }
    *pcVar4 = '\0';
    *local_30 = '\0';
    curl_msnprintf(local_27,7,"%ld",lVar3);
    u->portnum = lVar3;
    pcVar4 = (*Curl_cstrdup)(local_27);
    u->port = pcVar4;
    if (pcVar4 == (char *)0x0) {
      return CURLUE_OUT_OF_MEMORY;
    }
  }
  return CURLUE_OK;
}

Assistant:

UNITTEST CURLUcode Curl_parse_port(struct Curl_URL *u, char *hostname)
{
  char *portptr = NULL;
  char endbracket;
  int len;

  /*
   * Find the end of an IPv6 address, either on the ']' ending bracket or
   * a percent-encoded zone index.
   */
  if(1 == sscanf(hostname, "[%*45[0123456789abcdefABCDEF:.]%c%n",
                 &endbracket, &len)) {
    if(']' == endbracket)
      portptr = &hostname[len];
    else if('%' == endbracket) {
      int zonelen = len;
      if(1 == sscanf(hostname + zonelen, "%*[^]]%c%n", &endbracket, &len)) {
        if(']' != endbracket)
          return CURLUE_MALFORMED_INPUT;
        portptr = &hostname[--zonelen + len + 1];
      }
      else
        return CURLUE_MALFORMED_INPUT;
    }
    else
      return CURLUE_MALFORMED_INPUT;

    /* this is a RFC2732-style specified IP-address */
    if(portptr && *portptr) {
      if(*portptr != ':')
        return CURLUE_MALFORMED_INPUT;
    }
    else
      portptr = NULL;
  }
  else
    portptr = strchr(hostname, ':');

  if(portptr) {
    char *rest;
    long port;
    char portbuf[7];

    /* Browser behavior adaptation. If there's a colon with no digits after,
       just cut off the name there which makes us ignore the colon and just
       use the default port. Firefox, Chrome and Safari all do that. */
    if(!portptr[1]) {
      *portptr = '\0';
      return CURLUE_OK;
    }

    if(!ISDIGIT(portptr[1]))
      return CURLUE_BAD_PORT_NUMBER;

    port = strtol(portptr + 1, &rest, 10);  /* Port number must be decimal */

    if((port <= 0) || (port > 0xffff))
      /* Single unix standard says port numbers are 16 bits long, but we don't
         treat port zero as OK. */
      return CURLUE_BAD_PORT_NUMBER;

    if(rest[0])
      return CURLUE_BAD_PORT_NUMBER;

    *portptr++ = '\0'; /* cut off the name there */
    *rest = 0;
    /* generate a new port number string to get rid of leading zeroes etc */
    msnprintf(portbuf, sizeof(portbuf), "%ld", port);
    u->portnum = port;
    u->port = strdup(portbuf);
    if(!u->port)
      return CURLUE_OUT_OF_MEMORY;
  }

  return CURLUE_OK;
}